

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthStencilTests.cpp
# Opt level: O3

void __thiscall deqp::gles2::Functional::DepthStencilCase::deinit(DepthStencilCase *this)

{
  QuadRenderer *this_00;
  Surface *this_01;
  TextureLevel *pTVar1;
  pointer pCVar2;
  pointer pRVar3;
  pointer pRVar4;
  
  this_00 = this->m_renderer;
  if (this_00 != (QuadRenderer *)0x0) {
    deqp::gls::FragmentOpUtil::QuadRenderer::~QuadRenderer(this_00);
  }
  operator_delete(this_00,0x20);
  this_01 = this->m_refColorBuffer;
  if (this_01 != (Surface *)0x0) {
    tcu::Surface::~Surface(this_01);
  }
  operator_delete(this_01,0x18);
  pTVar1 = this->m_refDepthBuffer;
  if (pTVar1 != (TextureLevel *)0x0) {
    tcu::TextureLevel::~TextureLevel(pTVar1);
  }
  operator_delete(pTVar1,0x28);
  pTVar1 = this->m_refStencilBuffer;
  if (pTVar1 != (TextureLevel *)0x0) {
    tcu::TextureLevel::~TextureLevel(pTVar1);
  }
  operator_delete(pTVar1,0x28);
  operator_delete(this->m_refRenderer,0x11108);
  this->m_refDepthBuffer = (TextureLevel *)0x0;
  this->m_refStencilBuffer = (TextureLevel *)0x0;
  this->m_renderer = (QuadRenderer *)0x0;
  this->m_refColorBuffer = (Surface *)0x0;
  this->m_refRenderer = (ReferenceQuadRenderer *)0x0;
  pCVar2 = (this->m_baseClears).
           super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::ClearCommand>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_baseClears).
      super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::ClearCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish != pCVar2) {
    (this->m_baseClears).
    super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::ClearCommand>_>
    ._M_impl.super__Vector_impl_data._M_finish = pCVar2;
  }
  pRVar3 = (this->m_baseDepthRenders).
           super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_baseDepthRenders).
      super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish != pRVar3) {
    (this->m_baseDepthRenders).
    super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
    ._M_impl.super__Vector_impl_data._M_finish = pRVar3;
  }
  pRVar3 = (this->m_visualizeCommands).
           super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_visualizeCommands).
      super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish != pRVar3) {
    (this->m_visualizeCommands).
    super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
    ._M_impl.super__Vector_impl_data._M_finish = pRVar3;
  }
  pRVar4 = (this->m_refBaseDepthRenders).
           super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_refBaseDepthRenders).
      super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish != pRVar4) {
    (this->m_refBaseDepthRenders).
    super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
    ._M_impl.super__Vector_impl_data._M_finish = pRVar4;
  }
  pRVar4 = (this->m_refVisualizeCommands).
           super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_refVisualizeCommands).
      super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish != pRVar4) {
    (this->m_refVisualizeCommands).
    super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
    ._M_impl.super__Vector_impl_data._M_finish = pRVar4;
  }
  return;
}

Assistant:

void DepthStencilCase::deinit (void)
{
	delete m_renderer;
	delete m_refColorBuffer;
	delete m_refDepthBuffer;
	delete m_refStencilBuffer;
	delete m_refRenderer;

	m_renderer			= DE_NULL;
	m_refColorBuffer	= DE_NULL;
	m_refDepthBuffer	= DE_NULL;
	m_refStencilBuffer	= DE_NULL;
	m_refRenderer		= DE_NULL;

	m_baseClears.clear();
	m_baseDepthRenders.clear();
	m_visualizeCommands.clear();
	m_refBaseDepthRenders.clear();
	m_refVisualizeCommands.clear();
}